

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlStrncat(xmlChar *cur,xmlChar *add,int len)

{
  uint uVar1;
  size_t sVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  ulong __n;
  
  if (len != 0 && add != (xmlChar *)0x0) {
    if (-1 < len) {
      if (cur == (xmlChar *)0x0) {
        uVar4 = (ulong)(uint)len;
        pxVar3 = (xmlChar *)(*xmlMalloc)(uVar4 + 1);
        if (pxVar3 != (xmlChar *)0x0) {
          memcpy(pxVar3,add,uVar4);
          pxVar3[uVar4] = '\0';
          return pxVar3;
        }
      }
      else {
        sVar2 = strlen((char *)cur);
        uVar1 = (uint)sVar2;
        if (0x7fffffff < sVar2) {
          uVar1 = 0;
        }
        if ((int)uVar1 <= (int)(len ^ 0x7fffffffU) && -1 < (int)uVar1) {
          uVar4 = (ulong)uVar1;
          __n = (ulong)(uint)len;
          pxVar3 = (xmlChar *)(*xmlRealloc)(cur,__n + uVar4 + 1);
          if (pxVar3 != (xmlChar *)0x0) {
            memcpy(pxVar3 + uVar4,add,__n);
            pxVar3[__n + uVar4] = '\0';
            return pxVar3;
          }
          (*xmlFree)(cur);
        }
      }
    }
    cur = (xmlChar *)0x0;
  }
  return cur;
}

Assistant:

xmlChar *
xmlStrncat(xmlChar *cur, const xmlChar *add, int len) {
    int size;
    xmlChar *ret;

    if ((add == NULL) || (len == 0))
        return(cur);
    if (len < 0)
	return(NULL);
    if (cur == NULL)
        return(xmlStrndup(add, len));

    size = xmlStrlen(cur);
    if ((size < 0) || (size > INT_MAX - len))
        return(NULL);
    ret = (xmlChar *) xmlRealloc(cur, (size_t) size + len + 1);
    if (ret == NULL) {
        xmlFree(cur);
        return(NULL);
    }
    memcpy(&ret[size], add, len);
    ret[size + len] = 0;
    return(ret);
}